

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# calendar.cpp
# Opt level: O1

int32_t __thiscall
icu_63::Calendar::fieldDifference
          (Calendar *this,UDate targetMs,UCalendarDateFields field,UErrorCode *ec)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  ulong uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int32_t iVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  double millis;
  double dVar13;
  
  uVar6 = 0;
  if (U_ZERO_ERROR < *ec) {
    return 0;
  }
  millis = getTimeInMillis(this,ec);
  if (targetMs <= millis) {
    uVar12 = 0;
    if (millis <= targetMs) goto LAB_001e8594;
    uVar12 = 0;
    uVar7 = 0xffffffff;
    do {
      uVar10 = (ulong)uVar7;
      if (U_ZERO_ERROR < *ec) goto LAB_001e8509;
      setTimeInMillis(this,millis,ec);
      (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,uVar10,ec);
      dVar13 = getTimeInMillis(this,ec);
      iVar5 = 1;
      if (((dVar13 != targetMs) || (uVar8 = uVar7, NAN(dVar13) || NAN(targetMs))) &&
         (iVar5 = 7, uVar8 = uVar6, targetMs <= dVar13)) {
        iVar5 = 0;
        if (uVar7 * 2 == 0) {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
        }
        uVar12 = (ulong)uVar7;
        uVar7 = uVar7 * 2;
      }
      uVar6 = uVar8;
    } while (iVar5 == 0);
    if (iVar5 == 7) {
      uVar10 = (ulong)uVar7;
LAB_001e8509:
      do {
        iVar11 = (int)uVar12;
        iVar5 = 0;
        if ((iVar11 - (int)uVar10 < 2) || (iVar5 = 0, U_ZERO_ERROR < *ec)) goto LAB_001e8590;
        uVar7 = ((int)uVar10 - iVar11) / 2 + iVar11;
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)uVar7,ec);
        dVar13 = getTimeInMillis(this,ec);
        uVar4 = (ulong)uVar7;
        if (dVar13 < targetMs) {
          uVar10 = (ulong)uVar7;
          uVar4 = uVar12;
        }
        bVar1 = NAN(dVar13);
        bVar2 = NAN(targetMs);
        bVar3 = dVar13 != targetMs;
        if (bVar3) {
          uVar12 = uVar4;
        }
        if (bVar1 || bVar2) {
          uVar12 = uVar4;
        }
        if (bVar3) {
          uVar7 = uVar6;
        }
        if (!bVar1 && !bVar2) {
          uVar6 = uVar7;
        }
      } while ((bVar3) || (bVar1 || bVar2));
      goto LAB_001e8586;
    }
  }
  else {
    uVar12 = 0;
    uVar7 = 1;
    uVar8 = uVar6;
    do {
      uVar10 = (ulong)uVar7;
      uVar6 = uVar8;
      if (U_ZERO_ERROR < *ec) goto LAB_001e8488;
      setTimeInMillis(this,millis,ec);
      (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,uVar10,ec);
      dVar13 = getTimeInMillis(this,ec);
      iVar5 = 1;
      if (((dVar13 != targetMs) || (uVar6 = uVar7, NAN(dVar13) || NAN(targetMs))) &&
         (iVar5 = 3, uVar6 = uVar8, dVar13 <= targetMs)) {
        if (uVar7 == 0x7fffffff) {
          *ec = U_ILLEGAL_ARGUMENT_ERROR;
          iVar5 = 0;
          uVar7 = 0x7fffffff;
        }
        else {
          uVar6 = uVar7 * 2;
          if (0x7ffffffe < uVar6) {
            uVar6 = 0x7fffffff;
          }
          iVar5 = 0;
          uVar12 = (ulong)uVar7;
          uVar7 = uVar6;
          uVar6 = uVar8;
        }
      }
      uVar8 = uVar6;
    } while (iVar5 == 0);
    if (iVar5 == 3) {
      uVar10 = (ulong)uVar7;
LAB_001e8488:
      do {
        uVar7 = (int)uVar10 - (int)uVar12;
        iVar5 = 0;
        if (((int)uVar7 < 2) || (iVar5 = 0, U_ZERO_ERROR < *ec)) goto LAB_001e8590;
        uVar7 = (uVar7 >> 1) + (int)uVar12;
        setTimeInMillis(this,millis,ec);
        (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,(ulong)uVar7,ec);
        dVar13 = getTimeInMillis(this,ec);
        bVar1 = NAN(dVar13);
        bVar2 = NAN(targetMs);
        bVar3 = dVar13 != targetMs;
        uVar4 = (ulong)uVar7;
        if (targetMs < dVar13) {
          uVar10 = (ulong)uVar7;
          uVar4 = uVar12;
        }
        if (bVar3) {
          uVar12 = uVar4;
        }
        if (bVar1 || bVar2) {
          uVar12 = uVar4;
        }
        if (bVar3) {
          uVar7 = uVar6;
        }
        if (!bVar1 && !bVar2) {
          uVar6 = uVar7;
        }
      } while ((bVar3) || (bVar1 || bVar2));
LAB_001e8586:
      iVar5 = 1;
    }
  }
LAB_001e8590:
  if (iVar5 != 0) {
    return uVar6;
  }
LAB_001e8594:
  setTimeInMillis(this,millis,ec);
  (*(this->super_UObject)._vptr_UObject[7])(this,(ulong)field,uVar12,ec);
  iVar9 = 0;
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar9 = (int32_t)uVar12;
  }
  return iVar9;
}

Assistant:

int32_t Calendar::fieldDifference(UDate targetMs, UCalendarDateFields field, UErrorCode& ec) {
    if (U_FAILURE(ec)) return 0;
    int32_t min = 0;
    double startMs = getTimeInMillis(ec);
    // Always add from the start millis.  This accomodates
    // operations like adding years from February 29, 2000 up to
    // February 29, 2004.  If 1, 1, 1, 1 is added to the year
    // field, the DOM gets pinned to 28 and stays there, giving an
    // incorrect DOM difference of 1.  We have to add 1, reset, 2,
    // reset, 3, reset, 4.
    if (startMs < targetMs) {
        int32_t max = 1;
        // Find a value that is too large
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms > targetMs) {
                break;
            } else if (max < INT32_MAX) {
                min = max;
                max <<= 1;
                if (max < 0) {
                    max = INT32_MAX;
                }
            } else {
                // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                    __FILE__, __LINE__, fldName(field));
#endif
                ec = U_ILLEGAL_ARGUMENT_ERROR;
            }
        }
        // Do a binary search
        while ((max - min) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms > targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    } else if (startMs > targetMs) {
        int32_t max = -1;
        // Find a value that is too small
        while (U_SUCCESS(ec)) {
            setTimeInMillis(startMs, ec);
            add(field, max, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return max;
            } else if (ms < targetMs) {
                break;
            } else {
                min = max;
                max <<= 1;
                if (max == 0) {
                    // Field difference too large to fit into int32_t
#if defined (U_DEBUG_CAL)
                    fprintf(stderr, "%s:%d: ILLEGAL ARG because field %s's max too large for int32_t\n",
                        __FILE__, __LINE__, fldName(field));
#endif
                    ec = U_ILLEGAL_ARGUMENT_ERROR;
                }
            }
        }
        // Do a binary search
        while ((min - max) > 1 && U_SUCCESS(ec)) {
            int32_t t = min + (max - min)/2; // make sure intermediate values don't exceed INT32_MAX
            setTimeInMillis(startMs, ec);
            add(field, t, ec);
            double ms = getTimeInMillis(ec);
            if (ms == targetMs) {
                return t;
            } else if (ms < targetMs) {
                max = t;
            } else {
                min = t;
            }
        }
    }
    // Set calendar to end point
    setTimeInMillis(startMs, ec);
    add(field, min, ec);

    /* Test for buffer overflows */
    if(U_FAILURE(ec)) {
        return 0;
    }
    return min;
}